

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::kf_delete_char_left(Fl_Input *this)

{
  int iVar1;
  int e;
  int b;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    b = (this->super_Fl_Input_).position_;
    iVar1 = (this->super_Fl_Input_).mark_;
    e = iVar1;
    if (iVar1 == b) {
      e = iVar1 + -1;
      b = iVar1;
    }
    Fl_Input_::replace(&this->super_Fl_Input_,b,e,(char *)0x0,0);
  }
  else {
    fl_beep(0);
  }
  return 1;
}

Assistant:

int Fl_Input::kf_delete_char_left() {
  if (readonly()) { fl_beep(); return 1; }
  if (mark() != position()) cut();
  else cut(-1);
  return 1;
}